

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<unsigned_int>::Resize(TPZVec<unsigned_int> *this,int64_t newsize,uint *object)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  if (-1 < newsize) {
    lVar10 = this->fNElements;
    if (lVar10 != newsize) {
      if (newsize == 0) {
        puVar6 = (uint *)0x0;
      }
      else {
        puVar6 = (uint *)operator_new__(-(ulong)((ulong)newsize >> 0x3e != 0) | newsize * 4);
      }
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      if (lVar10 < 1) {
        lVar10 = 0;
      }
      else {
        puVar2 = this->fStore;
        lVar7 = 0;
        do {
          puVar6[lVar7] = puVar2[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar10 != lVar7);
      }
      auVar5 = _DAT_014d2b10;
      auVar4 = _DAT_014d28c0;
      auVar3 = _DAT_014d28b0;
      lVar7 = newsize - lVar10;
      if (lVar7 != 0 && lVar10 <= newsize) {
        uVar1 = *object;
        lVar8 = lVar7 + -1;
        auVar11._8_4_ = (int)lVar8;
        auVar11._0_8_ = lVar8;
        auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar11 = auVar11 ^ _DAT_014d28c0;
        do {
          auVar13._8_4_ = (int)uVar9;
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = (int)(uVar9 >> 0x20);
          auVar14 = (auVar13 | auVar3) ^ auVar4;
          iVar12 = auVar11._4_4_;
          if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                      iVar12 < auVar14._4_4_) & 1)) {
            puVar6[lVar10 + uVar9] = uVar1;
          }
          if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
              auVar14._12_4_ <= auVar11._12_4_) {
            puVar6[lVar10 + uVar9 + 1] = uVar1;
          }
          auVar13 = (auVar13 | auVar5) ^ auVar4;
          iVar15 = auVar13._4_4_;
          if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
            puVar6[lVar10 + uVar9 + 2] = uVar1;
            puVar6[lVar10 + uVar9 + 3] = uVar1;
          }
          uVar9 = uVar9 + 4;
        } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar9);
      }
      if (this->fStore != (uint *)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = puVar6;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}